

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::ValueFlagList<int,_args::detail::vector,_args::ValueReader>::~ValueFlagList
          (ValueFlagList<int,_args::detail::vector,_args::ValueReader> *this)

{
  ValueFlagList<int,_args::detail::vector,_args::ValueReader> *this_local;
  
  ~ValueFlagList(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ValueFlagList() {}